

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

vm_obj_id_t __thiscall
CVmObject::find_intcls_for_mod(CVmObject *this,vm_obj_id_t self,vm_obj_id_t mod_obj)

{
  CVmMetaclass *this_00;
  vm_meta_entry_t *pvVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  vm_meta_entry_t *entry;
  undefined8 in_stack_ffffffffffffffe0;
  int reg_idx;
  vm_obj_id_t local_4;
  
  reg_idx = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  this_00 = (CVmMetaclass *)(**(code **)*in_RDI)();
  CVmMetaclass::get_reg_idx(this_00);
  pvVar1 = CVmMetaTable::get_entry_from_reg((CVmMetaTable *)CONCAT44(in_ESI,in_EDX),reg_idx);
  if ((pvVar1 == (vm_meta_entry_t *)0x0) || (pvVar1->class_obj_ == 0)) {
    local_4 = 0;
  }
  else {
    vm_objp(0);
    local_4 = CVmObjClass::find_mod_src_obj
                        ((CVmObjClass *)CONCAT44(in_ESI,in_EDX),(vm_obj_id_t)((ulong)pvVar1 >> 0x20)
                         ,(vm_obj_id_t)pvVar1);
  }
  return local_4;
}

Assistant:

vm_obj_id_t CVmObject::find_intcls_for_mod(VMG_ vm_obj_id_t self,
                                           vm_obj_id_t mod_obj)
{
    /* get my metaclass from the dependency table */
    vm_meta_entry_t *entry = (G_meta_table
             ->get_entry_from_reg(get_metaclass_reg()->get_reg_idx()));

    /* 
     *   if there's an intrinsic class object for the metaclass, ask it to do
     *   the work 
     */
    if (entry != 0 && entry->class_obj_ != VM_INVALID_OBJ)
        return (((CVmObjClass *)vm_objp(vmg_ entry->class_obj_))
                ->find_mod_src_obj(vmg_ entry->class_obj_, mod_obj));

    /* there's no intrinsic metaclass, so we can't find what we need */
    return VM_INVALID_OBJ;
}